

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DeferredTypeHandlerBase::ConvertFunction
          (DeferredTypeHandlerBase *this,JavascriptFunction *instance,
          DynamicTypeHandler *typeHandler)

{
  byte bVar1;
  ScriptContext *scriptContext;
  RecyclableObject *value;
  long *plVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  FunctionProxy *this_00;
  ScriptFunctionType *pSVar9;
  ScriptFunction *this_01;
  ParseableFunctionInfo *pPVar10;
  ScriptFunctionType *pSVar11;
  int index;
  
  if (*(DeferredTypeHandlerBase **)
       ((instance->super_DynamicObject).super_RecyclableObject.type.ptr + 1) != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xd,"(instance->GetDynamicType()->GetTypeHandler() == this)",
                                "instance->GetDynamicType()->GetTypeHandler() == this");
    if (!bVar4) goto LAB_00c21f8a;
    *puVar8 = 0;
  }
  if ((this->super_DynamicTypeHandler).inlineSlotCapacity != typeHandler->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xe,"(this->inlineSlotCapacity == typeHandler->inlineSlotCapacity)"
                                ,"this->inlineSlotCapacity == typeHandler->inlineSlotCapacity");
    if (!bVar4) goto LAB_00c21f8a;
    *puVar8 = 0;
  }
  if ((this->super_DynamicTypeHandler).offsetOfInlineSlots != typeHandler->offsetOfInlineSlots) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xf,
                                "(this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots)",
                                "this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots");
    if (!bVar4) goto LAB_00c21f8a;
    *puVar8 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      (typeHandler->propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x10,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar4) goto LAB_00c21f8a;
    *puVar8 = 0;
  }
  bVar1 = (this->super_DynamicTypeHandler).flags;
  bVar4 = CrossSite::IsThunk((JavascriptMethod)
                             ((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->
                             entryPoint);
  scriptContext =
       (((((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
       ->super_JavascriptLibraryBase).scriptContext.ptr;
  DynamicObject::EnsureSlots
            (&instance->super_DynamicObject,0,typeHandler->slotCapacity,scriptContext,typeHandler);
  this_00 = JavascriptFunction::GetFunctionProxy(instance);
  if (this_00 == (FunctionProxy *)0x0) {
LAB_00c21d8e:
    DynamicTypeHandler::SetInstanceTypeHandler(typeHandler,&instance->super_DynamicObject,true);
    if (((bVar1 & 0x20) == 0 && this_00 != (FunctionProxy *)0x0) && ((typeHandler->flags & 8) != 0))
    {
      bVar5 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ShareFuncTypesPhase);
      if (!bVar5) {
        this_01 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(instance);
        pSVar9 = ScriptFunction::GetScriptFunctionType(this_01);
        if (bVar4) {
          BVar6 = FunctionProxy::HasParseableInfo(this_00);
          if (BVar6 != 0) {
            pPVar10 = FunctionProxy::GetParseableFunctionInfo(this_00);
            if ((pPVar10->crossSiteUndeferredFunctionType).ptr == (ScriptFunctionType *)0x0) {
              pPVar10 = FunctionProxy::GetParseableFunctionInfo(this_00);
              ParseableFunctionInfo::SetCrossSiteUndeferredFunctionType(pPVar10,pSVar9);
            }
          }
        }
        else {
          pSVar11 = FunctionProxy::GetUndeferredFunctionType(this_00);
          if (pSVar11 == (ScriptFunctionType *)0x0) {
            FunctionProxy::SetUndeferredFunctionType(this_00,pSVar9);
          }
        }
        DynamicObject::ShareType(&instance->super_DynamicObject);
      }
    }
  }
  else {
    if (bVar4) {
      pSVar9 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
    }
    else {
      pSVar9 = FunctionProxy::GetUndeferredFunctionType(this_00);
    }
    if ((pSVar9 == (ScriptFunctionType *)0x0 || (bVar1 & 0x20) != 0) ||
       ((pSVar9->super_DynamicType).super_Type.prototype.ptr !=
        (((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->prototype).ptr))
    goto LAB_00c21d8e;
    if ((pSVar9->super_DynamicType).isShared == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                  ,0x27,"(undeferredFunctionType->GetIsShared())",
                                  "undeferredFunctionType->GetIsShared()");
      if (!bVar4) goto LAB_00c21f8a;
      *puVar8 = 0;
    }
    DynamicObject::ReplaceType(&instance->super_DynamicObject,&pSVar9->super_DynamicType);
  }
  value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
          ).undefinedValue.ptr;
  iVar7 = (*typeHandler->_vptr_DynamicTypeHandler[6])(typeHandler);
  if (typeHandler->slotCapacity < iVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x42,"(propertyCount <= typeHandler->GetSlotCapacity())",
                                "propertyCount <= typeHandler->GetSlotCapacity()");
    if (!bVar4) {
LAB_00c21f8a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  index = 0;
  if (iVar7 < 1) {
    iVar7 = index;
  }
  for (; iVar7 != index; index = index + 1) {
    DynamicTypeHandler::SetSlotUnchecked(&instance->super_DynamicObject,index,value);
  }
  if ((bVar1 & 0x20) != 0) {
    plVar2 = *(long **)((instance->super_DynamicObject).super_RecyclableObject.type.ptr + 1);
    (**(code **)(*plVar2 + 0x290))(plVar2,instance);
    return;
  }
  return;
}

Assistant:

void DeferredTypeHandlerBase::ConvertFunction(JavascriptFunction * instance, DynamicTypeHandler * typeHandler)
    {
        Assert(instance->GetDynamicType()->GetTypeHandler() == this);
        Assert(this->inlineSlotCapacity == typeHandler->inlineSlotCapacity);
        Assert(this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots);
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());

        // Since the caller owns the typeHandler the instance is transitioning to, the caller should have
        // set up the singleton instance on that handler, if fixed fields are desired.  The caller is
        // also responsible for populating PropertyTypes to indicate whether there are any read-only
        // properties unknown to the type handler.

        bool isProto = this->GetIsPrototype();
        bool isCrossSite = CrossSite::IsThunk(instance->GetType()->GetEntryPoint()); 

        ScriptContext* scriptContext = instance->GetScriptContext();
        instance->EnsureSlots(0, typeHandler->GetSlotCapacity(), scriptContext, typeHandler);

        FunctionProxy * functionProxy = instance->GetFunctionProxy();

        ScriptFunctionType * undeferredFunctionType = nullptr;
        if (functionProxy)
        {
            undeferredFunctionType = isCrossSite ? functionProxy->GetCrossSiteUndeferredFunctionType() : functionProxy->GetUndeferredFunctionType();
        }

        if (undeferredFunctionType && !isProto && (undeferredFunctionType->GetPrototype() == instance->GetType()->GetPrototype()))
        {
            Assert(undeferredFunctionType->GetIsShared());
            instance->ReplaceType(undeferredFunctionType);
        }
        else
        {
            typeHandler->SetInstanceTypeHandler(instance);
            if (functionProxy && !isProto && typeHandler->GetMayBecomeShared() && !PHASE_OFF1(ShareFuncTypesPhase))
            {
                ScriptFunctionType *newType = UnsafeVarTo<ScriptFunction>(instance)->GetScriptFunctionType();
                if (isCrossSite)
                {
                    if (functionProxy->HasParseableInfo() && !functionProxy->GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType())
                    {
                        functionProxy->GetParseableFunctionInfo()->SetCrossSiteUndeferredFunctionType(newType);
                    }
                }
                else if (!functionProxy->GetUndeferredFunctionType())
                {
                    functionProxy->SetUndeferredFunctionType(newType);
                }
                instance->ShareType();
            }
        }

        // We may be changing to a type handler that already has some properties. Initialize those to undefined.
        const Var undefined = scriptContext->GetLibrary()->GetUndefined();
        const BigPropertyIndex propertyCount = typeHandler->GetPropertyCount();
        Assert(propertyCount <= typeHandler->GetSlotCapacity());
        for(BigPropertyIndex i = 0; i < propertyCount; ++i)
        {
            typeHandler->SetSlotUnchecked(instance, i, undefined);
        }

        if (isProto)
        {
            instance->GetDynamicType()->GetTypeHandler()->SetIsPrototype(instance);
        }
    }